

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  DescriptorScriptReference *this;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  pointer pAVar13;
  AddressType AVar14;
  bool bVar15;
  uint32_t uVar16;
  DescriptorScriptType DVar17;
  uint64_t uVar18;
  int64_t iVar19;
  pointer pAVar20;
  ulong uVar21;
  NetType net_type;
  pointer pAVar22;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Script *pSVar23;
  ConfidentialAssetId *this_01;
  uint32_t txin_size;
  undefined4 uStack_924;
  uint32_t wit_size;
  undefined4 uStack_90c;
  pointer local_908;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  ByteData txid;
  ByteData block_hash;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  AddressFormatData local_888;
  pointer local_848;
  TapBranch local_830;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_7b8;
  Script local_7a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_760;
  Script local_730;
  Script local_6f8;
  Script local_6c0;
  Descriptor desc;
  UtxoData output;
  
  if (utxo != (Utxo *)0x0) {
    UtxoData::UtxoData(&output,utxo_data);
    memset(utxo,0,0xd8);
    utxo->block_height = utxo_data->block_height;
    utxo->vout = utxo_data->vout;
    utxo->binary_data = utxo_data->binary_data;
    uVar18 = core::Amount::GetSatoshiValue(&utxo_data->amount);
    utxo->amount = uVar18;
    core::BlockHash::GetData(&block_hash,&utxo_data->block_hash);
    bVar15 = core::ByteData::Empty(&block_hash);
    if (!bVar15) {
      core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
                 &block_hash);
      uVar5 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
      uVar6 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
      uVar7 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
      uVar8 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
      uVar9 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
      uVar10 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
      uVar11 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
      uVar12 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
      uVar1 = *(undefined8 *)
               &((elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
                super__Rb_tree_header._M_header;
      p_Var2 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(utxo->block_hash + 0x10) =
           ((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
      *(_Base_ptr *)(utxo->block_hash + 0x18) = p_Var2;
      utxo->block_hash[0] = uVar5;
      utxo->block_hash[1] = uVar6;
      utxo->block_hash[2] = uVar7;
      utxo->block_hash[3] = uVar8;
      utxo->block_hash[4] = uVar9;
      utxo->block_hash[5] = uVar10;
      utxo->block_hash[6] = uVar11;
      utxo->block_hash[7] = uVar12;
      *(undefined8 *)(utxo->block_hash + 8) = uVar1;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    core::Txid::GetData(&txid,&utxo_data->txid);
    bVar15 = core::ByteData::Empty(&txid);
    if (!bVar15) {
      core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,&txid);
      uVar5 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
      uVar6 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
      uVar7 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
      uVar8 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
      uVar9 = ((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
      uVar10 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
      uVar11 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
      uVar12 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
      uVar1 = *(undefined8 *)
               &((elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
                super__Rb_tree_header._M_header;
      p_Var2 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(utxo->txid + 0x10) =
           ((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
      *(_Base_ptr *)(utxo->txid + 0x18) = p_Var2;
      utxo->txid[0] = uVar5;
      utxo->txid[1] = uVar6;
      utxo->txid[2] = uVar7;
      utxo->txid[3] = uVar8;
      utxo->txid[4] = uVar9;
      utxo->txid[5] = uVar10;
      utxo->txid[6] = uVar11;
      utxo->txid[7] = uVar12;
      *(undefined8 *)(utxo->txid + 8) = uVar1;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((utxo_data->descriptor)._M_string_length == 0) {
      pAVar22 = (pointer)0x0;
      pAVar20 = (pointer)0x0;
    }
    else {
      core::GetBitcoinAddressFormatList();
      bVar15 = core::ConfidentialAssetId::IsEmpty(&utxo_data->asset);
      net_type = kMainnet;
      if (!bVar15) {
        core::GetElementsAddressFormatList();
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        operator=(&addr_prefixes,&elements_prefixes);
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        ~vector(&elements_prefixes);
        net_type = kLiquidV1;
      }
      core::Address::GetAddress_abi_cxx11_((string *)&elements_prefixes,&utxo_data->address);
      pAVar22 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pAVar20 = addr_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pAVar22 != (pointer)0x0) {
        this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)addr_prefixes.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if (addr_prefixes.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            addr_prefixes.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(this_00);
            this_00 = this_00 + 1;
          } while (this_00 !=
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)addr_prefixes.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          addr_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar20;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&elements_prefixes,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&(utxo_data->address).format_data_);
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        emplace_back<cfd::core::AddressFormatData>
                  (&addr_prefixes,(AddressFormatData *)&elements_prefixes);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&elements_prefixes);
        net_type = (utxo_data->address).type_;
      }
      core::Descriptor::Parse(&desc,&utxo_data->descriptor,&addr_prefixes);
      uVar16 = core::Descriptor::GetNeedArgumentNum(&desc);
      if (uVar16 == 0) {
        core::Descriptor::GetReferenceAll
                  ((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                    *)&wit_size,&desc,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        this = (DescriptorScriptReference *)
               CONCAT44(uStack_90c,CONCAT22(wit_size._2_2_,(uint16_t)wit_size));
        core::DescriptorScriptReference::GetLockingScript((Script *)&elements_prefixes,this);
        core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
        core::Script::~Script((Script *)&elements_prefixes);
        core::Script::GetData((ByteData *)&txin_size,&output.locking_script);
        core::ByteData::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
                   (ByteData *)&txin_size);
        pAVar20 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar22 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((void *)CONCAT44(uStack_924,txin_size) != (void *)0x0) {
          operator_delete((void *)CONCAT44(uStack_924,txin_size));
        }
        DVar17 = core::DescriptorScriptReference::GetScriptType(this);
        if ((DVar17 != kDescriptorScriptRaw) ||
           (bVar15 = core::DescriptorScriptReference::HasAddress(this), bVar15)) {
          output.address_type = core::DescriptorScriptReference::GetAddressType(this);
          core::DescriptorScriptReference::GenerateAddress
                    ((Address *)&elements_prefixes,this,net_type);
          core::Address::operator=(&output.address,(Address *)&elements_prefixes);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_760);
          core::Script::~Script(&local_7a0);
          local_830._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_7b8);
          core::TapBranch::~TapBranch(&local_830);
          if (local_848 != (pointer)0x0) {
            operator_delete(local_848);
          }
          if ((pointer)local_888.map_._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              (pointer)0x0) {
            operator_delete((void *)local_888.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
          }
          if ((pointer)local_888.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (pointer)0x0) {
            operator_delete(local_888.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          if (elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_888) {
            operator_delete(elements_prefixes.
                            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          bVar15 = core::DescriptorScriptReference::HasRedeemScript(local_908 + -1);
          if (bVar15) {
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&elements_prefixes,local_908 + -1);
            core::Script::operator=(&output.redeem_script,(Script *)&elements_prefixes);
            core::Script::~Script((Script *)&elements_prefixes);
          }
        }
        utxo->address_type = (undefined2)output.address_type;
        std::
        vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)&wit_size);
      }
      else {
        pAVar22 = (pointer)0x0;
        pAVar20 = (pointer)0x0;
      }
      core::DescriptorNode::~DescriptorNode(&desc.root_node_);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&addr_prefixes);
    }
    if (pAVar22 == pAVar20) {
      core::Address::GetAddress_abi_cxx11_((string *)&elements_prefixes,&output.address);
      pAVar13 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pAVar13 == (pointer)0x0) {
        pSVar23 = &utxo_data->locking_script;
        bVar15 = core::Script::IsEmpty(pSVar23);
        if (!bVar15) {
          core::Script::GetData((ByteData *)&desc,pSVar23);
          core::ByteData::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
                     (ByteData *)&desc);
          pAVar20 = elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pAVar13 = elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pAVar22 != (pointer)0x0) {
            operator_delete(pAVar22);
          }
          if (elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(elements_prefixes.
                            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (desc.root_node_.name_._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(desc.root_node_.name_._M_dataplus._M_p);
          }
          bVar15 = core::Script::IsP2wpkhScript(pSVar23);
          if (bVar15) {
            utxo->address_type = 4;
          }
          else {
            bVar15 = core::Script::IsP2wshScript(pSVar23);
            if (bVar15) {
              utxo->address_type = 3;
            }
            else {
              bVar15 = core::Script::IsP2pkhScript(pSVar23);
              if (bVar15) {
                utxo->address_type = 2;
              }
              else {
                bVar15 = core::Script::IsTaprootScript(pSVar23);
                if (bVar15) {
                  utxo->address_type = 7;
                }
                else {
                  bVar15 = core::Script::IsWitnessProgram(pSVar23);
                  if (bVar15) {
                    core::Script::GetElementList
                              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                *)&elements_prefixes,pSVar23);
                    iVar19 = core::ScriptElement::GetNumber
                                       ((ScriptElement *)
                                        elements_prefixes.
                                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    bVar15 = iVar19 != 0;
                    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ::~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)&elements_prefixes);
                  }
                  else {
                    bVar15 = false;
                  }
                  if (bVar15) {
                    utxo->address_type = 8;
                  }
                  else {
                    utxo->address_type = 1;
                  }
                }
              }
            }
          }
          output.address_type = (AddressType)utxo->address_type;
          pAVar22 = pAVar13;
        }
      }
      else {
        core::Address::GetLockingScript((Script *)&elements_prefixes,&output.address);
        core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
        core::Script::~Script((Script *)&elements_prefixes);
        core::Script::GetData((ByteData *)&desc,&output.locking_script);
        core::ByteData::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
                   (ByteData *)&desc);
        pAVar20 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar13 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pAVar22 != (pointer)0x0) {
          operator_delete(pAVar22);
        }
        if (elements_prefixes.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(elements_prefixes.
                          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (desc.root_node_.name_._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(desc.root_node_.name_._M_dataplus._M_p);
        }
        if ((output.address.addr_type_ != kP2shAddress) ||
           (1 < output.address_type - kP2shP2wshAddress)) {
          output.address_type = output.address.addr_type_;
        }
        utxo->address_type = (undefined2)output.address_type;
        pAVar22 = pAVar13;
      }
    }
    if (pAVar22 != pAVar20) {
      uVar21 = (long)pAVar20 - (long)pAVar22;
      utxo->script_length = (uint16_t)uVar21;
      if (((uint)uVar21 & 0xfff8) < 0x28) {
        memcpy(utxo->locking_script,pAVar22,uVar21 & 0xffff);
      }
    }
    wit_size._0_2_ = 0;
    wit_size._2_2_ = 0;
    txin_size = 0;
    bVar15 = core::Script::IsEmpty(&output.scriptsig_template);
    pSVar23 = &output.scriptsig_template;
    if (bVar15) {
      pSVar23 = (Script *)0x0;
    }
    this_01 = &utxo_data->asset;
    bVar15 = core::ConfidentialAssetId::IsEmpty(this_01);
    if (!bVar15) {
      core::ConfidentialAssetId::GetData((ByteData *)&addr_prefixes,this_01);
      core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&desc,
                 (ByteData *)&addr_prefixes);
      if (addr_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(addr_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      utxo->asset[0x20] = desc.root_node_.name_._M_dataplus._M_p[0x20];
      uVar1 = *(undefined8 *)desc.root_node_.name_._M_dataplus._M_p;
      uVar3 = *(undefined8 *)(desc.root_node_.name_._M_dataplus._M_p + 8);
      uVar4 = *(undefined8 *)(desc.root_node_.name_._M_dataplus._M_p + 0x18);
      *(undefined8 *)(utxo->asset + 0x10) =
           *(undefined8 *)(desc.root_node_.name_._M_dataplus._M_p + 0x10);
      *(undefined8 *)(utxo->asset + 0x18) = uVar4;
      *(undefined8 *)utxo->asset = uVar1;
      *(undefined8 *)(utxo->asset + 8) = uVar3;
      bVar15 = core::ConfidentialAssetId::HasBlinding(this_01);
      AVar14 = output.address_type;
      utxo->blinded = bVar15;
      core::Script::Script(&local_6c0,&output.redeem_script);
      core::Script::Script(&local_6f8);
      core::ConfidentialTxIn::EstimateTxInSize
                (AVar14,&local_6c0,0,&local_6f8,false,false,&wit_size,&txin_size,false,pSVar23,0,
                 0x34,(uint32_t *)0x0,0);
      core::Script::~Script(&local_6f8);
      core::Script::~Script(&local_6c0);
      txin_size = txin_size - 0x29;
      utxo->witness_size_max = (uint16_t)wit_size;
      utxo->uscript_size_max = (uint16_t)txin_size;
      if (desc.root_node_.name_._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(desc.root_node_.name_._M_dataplus._M_p);
      }
    }
    AVar14 = output.address_type;
    if (txin_size == 0 && CONCAT22(wit_size._2_2_,(uint16_t)wit_size) == 0) {
      wit_size._0_2_ = 0;
      wit_size._2_2_ = 0;
      txin_size = 0;
      core::Script::Script(&local_730,&output.redeem_script);
      core::TxIn::EstimateTxInSize(AVar14,&local_730,&wit_size,&txin_size,pSVar23);
      core::Script::~Script(&local_730);
      txin_size = txin_size - 0x29;
      utxo->witness_size_max = (uint16_t)wit_size;
      utxo->uscript_size_max = (uint16_t)txin_size;
    }
    if (dest != (UtxoData *)0x0) {
      UtxoData::operator=(dest,&output);
    }
    if (pAVar22 != (pointer)0x0) {
      operator_delete(pAVar22);
    }
    if (txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (block_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(block_hash.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    UtxoData::~UtxoData(&output);
  }
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}